

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dunk.c
# Opt level: O1

void envy_bios_print_hdtvtt(envy_bios *bios,FILE *out,uint mask)

{
  byte bVar1;
  ushort uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = (bios->hdtvtt).offset;
  if ((mask >> 0x16 & 1) == 0 || uVar2 == 0) {
    return;
  }
  bVar1 = (bios->hdtvtt).version;
  uVar4 = (ulong)(bVar1 >> 4);
  uVar3 = (ulong)(bVar1 & 0xf);
  if ((bios->hdtvtt).valid != '\0') {
    fprintf((FILE *)out,"HDTVTT table at 0x%04x version %d.%d\n",(ulong)uVar2,uVar4,uVar3);
    envy_bios_dump_hex(bios,out,(uint)(bios->hdtvtt).offset,(uint)(bios->hdtvtt).hlen,mask);
    if ((bios->hdtvtt).entriesnum != '\0') {
      uVar4 = 0;
      do {
        envy_bios_dump_hex(bios,out,(uint)(bios->hdtvtt).entries[uVar4].offset,
                           (uint)(bios->hdtvtt).rlen,mask);
        uVar4 = uVar4 + 1;
      } while (uVar4 < (bios->hdtvtt).entriesnum);
    }
    fputc(10,(FILE *)out);
    return;
  }
  fprintf((FILE *)out,"Failed to parse HDTVTT table at 0x%04x version %d.%d\n\n",(ulong)uVar2,uVar4,
          uVar3);
  return;
}

Assistant:

void envy_bios_print_hdtvtt (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_hdtvtt *hdtvtt = &bios->hdtvtt;
	if (!hdtvtt->offset || !(mask & ENVY_BIOS_PRINT_DUNK))
		return;
	if (!hdtvtt->valid) {
		fprintf(out, "Failed to parse HDTVTT table at 0x%04x version %d.%d\n\n", hdtvtt->offset, hdtvtt->version >> 4, hdtvtt->version & 0xf);
		return;
	}
	fprintf(out, "HDTVTT table at 0x%04x version %d.%d\n", hdtvtt->offset, hdtvtt->version >> 4, hdtvtt->version & 0xf);
	envy_bios_dump_hex(bios, out, hdtvtt->offset, hdtvtt->hlen, mask);
	int i;
	for (i = 0; i < hdtvtt->entriesnum; i++) {
		struct envy_bios_hdtvtt_entry *entry = &hdtvtt->entries[i];
		envy_bios_dump_hex(bios, out, entry->offset, hdtvtt->rlen, mask);
	}
	fprintf(out, "\n");
}